

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupSelectedOutputs(Gia_Man_t *p,Vec_Int_t *vOutsLeft)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12e,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vCos->nSize < vOutsLeft->nSize) {
    __assert_fail("Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x12f,"Gia_Man_t *Gia_ManDupSelectedOutputs(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  uVar10 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar10 <= lVar12) goto LAB_0069d229;
      iVar1 = pVVar8->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0069d20a;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_0069d267:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0069d267;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCis;
      uVar10 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
  }
  if (0 < vOutsLeft->nSize) {
    lVar12 = 0;
    do {
      uVar2 = vOutsLeft->pArray[lVar12];
      iVar1 = p->vCos->nSize;
      if (iVar1 - p->nRegs <= (int)uVar2) goto LAB_0069d248;
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) goto LAB_0069d229;
      iVar1 = p->vCos->pArray[uVar2];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0069d20a;
      Gia_ManDupOrderDfs_rec
                (p_00,p,p->pObjs + iVar1 +
                        -(ulong)((uint)*(undefined8 *)(p->pObjs + iVar1) & 0x1fffffff));
      lVar12 = lVar12 + 1;
    } while (lVar12 < vOutsLeft->nSize);
  }
  if (0 < vOutsLeft->nSize) {
    lVar12 = 0;
    do {
      uVar2 = vOutsLeft->pArray[lVar12];
      iVar1 = p->vCos->nSize;
      if (iVar1 - p->nRegs <= (int)uVar2) {
LAB_0069d248:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar2 < 0) || (iVar1 <= (int)uVar2)) {
LAB_0069d229:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar2];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0069d20a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar11 = (uint)*(undefined8 *)(p->pObjs + iVar1);
      uVar2 = (p->pObjs + iVar1)[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar11 >> 0x1d & 1 ^ uVar2);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vOutsLeft->nSize);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupSelectedOutputs( Gia_Man_t * p, Vec_Int_t * vOutsLeft )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iOut;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) >= Vec_IntSize(vOutsLeft) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(Gia_ManPo(p, iOut)) );
    Vec_IntForEachEntry( vOutsLeft, iOut, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, iOut)) );
    return pNew;
}